

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_1f0 [8];
  CustomServer server;
  
  server.max_fail_attempt._4_4_ = 0;
  CustomServer::CustomServer((CustomServer *)local_1f0,60000);
  blcl::net::server_interface<MsgType>::start((server_interface<MsgType> *)local_1f0);
  do {
    blcl::net::server_interface<MsgType>::update
              ((server_interface<MsgType> *)local_1f0,0xffffffffffffffff,true);
  } while( true );
}

Assistant:

int main() {
    CustomServer server(60000);
    server.start();

    while (1) {
        server.update();
    }

    return 0;
}